

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget,string *output)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmGeneratorTarget *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  pointer this_01;
  cmLocalGenerator *lg;
  string *psVar4;
  undefined1 local_228 [8];
  string err_1;
  undefined1 local_200 [8];
  string err;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  cmGeneratorTarget *local_170;
  cmGeneratorTarget *target;
  cmLocalGenerator *localGen;
  string targetName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_b8 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string local_88 [8];
  string val;
  string prop;
  anon_class_16_2_c95d1c49 print_err;
  string *output_local;
  bool ignoreMissingTarget_local;
  string *executable_local;
  GenVarsT *genVars_local;
  cmQtAutoGenInitializer *this_local;
  
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)&val.field_2 + 8)
  ;
  prop.field_2._8_8_ = this;
  std::operator+(__return_storage_ptr__,genVars->GenNameUpper,"_EXECUTABLE");
  pcVar2 = cmTarget::GetSafeProperty(this->Target->Target,__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,pcVar2,
             (allocator<char> *)
             ((long)&lfbt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&lfbt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmTarget::GetMakefile(this->Target->Target);
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&cge,
               (cmListFileBacktrace *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_b8,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_d0,(string *)local_b8);
    this_01 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_d0);
    lg = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
    std::__cxx11::string::string((string *)&local_118);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (this_01,lg,&local_f0,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0
                        ,(cmGeneratorExpressionDAGChecker *)0x0,&local_118);
    std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_d0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b8);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &ge.Backtrace.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) || (ignoreMissingTarget)) {
      bVar1 = cmsys::SystemTools::FileExists(&genVars->Executable);
      genVars->ExecutableExists = bVar1;
      this_local._7_1_ = 1;
      targetName.field_2._12_4_ = 1;
    }
    else {
      std::operator+(&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&val.field_2 + 8)," evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      this_local._7_1_ = 0;
      targetName.field_2._12_4_ = 1;
    }
  }
  else {
    targetName.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  if (targetName.field_2._12_4_ == 0) {
    std::__cxx11::string::string((string *)&localGen);
    if ((this->QtVersion).Major == 4) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt4::");
    }
    else if ((this->QtVersion).Major == 5) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt5::");
    }
    else if ((this->QtVersion).Major == 6) {
      std::__cxx11::string::operator=((string *)&localGen,"Qt6::");
    }
    std::__cxx11::string::operator+=((string *)&localGen,(string *)executable);
    target = (cmGeneratorTarget *)cmGeneratorTarget::GetLocalGenerator(this->Target);
    local_170 = cmLocalGenerator::FindGeneratorTargetToUse
                          ((cmLocalGenerator *)target,(string *)&localGen);
    if (local_170 == (cmGeneratorTarget *)0x0) {
      if (ignoreMissingTarget) {
        this_local._7_1_ = 1;
        targetName.field_2._12_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"Could not find ",
                   (allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(err_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)local_200,(string *)executable);
        std::__cxx11::string::operator+=((string *)local_200," executable target ");
        std::__cxx11::string::operator+=((string *)local_200,(string *)&localGen);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_200);
        this_local._7_1_ = 0;
        targetName.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_200);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&genVars->ExecutableTargetName,(string *)&localGen);
      genVars->ExecutableTarget = local_170;
      bVar1 = cmGeneratorTarget::IsImported(local_170);
      this_00 = local_170;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
        cmGeneratorTarget::ImportedGetLocation(&local_190,this_00,&local_1b0);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d8,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
        pcVar2 = cmGeneratorTarget::GetLocation(this_00,&local_1d8);
        std::__cxx11::string::operator=((string *)&genVars->Executable,pcVar2);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
      }
      targetName.field_2._12_4_ = 0;
    }
    std::__cxx11::string::~string((string *)&localGen);
    if (targetName.field_2._12_4_ == 0) {
      std::__cxx11::string::string((string *)local_228);
      bVar1 = cmQtAutoGenGlobalInitializer::GetExecutableTestOutput
                        (this->GlobalInitializer,executable,&genVars->Executable,(string *)local_228
                         ,output);
      if (bVar1) {
        genVars->ExecutableExists = true;
      }
      else {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_228);
        this_local._7_1_ = 0;
      }
      targetName.field_2._13_3_ = 0;
      targetName.field_2._M_local_buf[0xc] = !bVar1;
      std::__cxx11::string::~string((string *)local_228);
      if (targetName.field_2._12_4_ == 0) {
        this_local._7_1_ = 1;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget,
                                             std::string* output) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Check if the provided executable already exists (it's possible for it
      // not to exist when building Qt itself).
      genVars.ExecutableExists = cmSystemTools::FileExists(genVars.Executable);
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Test executable
  {
    std::string err;
    if (!this->GlobalInitializer->GetExecutableTestOutput(
          executable, genVars.Executable, err, output)) {
      print_err(err);
      return false;
    }
    genVars.ExecutableExists = true;
  }

  return true;
}